

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall cmMakefileTargetGenerator::WriteTargetDependRules(cmMakefileTargetGenerator *this)

{
  cmLocalUnixMakefileGenerator3 *pcVar1;
  byte bVar2;
  bool bVar3;
  cmGeneratedFileStream *this_00;
  ostream *poVar4;
  reference pbVar5;
  string *psVar6;
  value_type local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350 [32];
  string local_330;
  string local_310;
  undefined1 local_2f0 [8];
  ostringstream depCmd;
  undefined1 local_178 [8];
  string depTarget;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string *working_dir;
  string *d;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  string local_a8;
  reference local_88;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pi;
  iterator __end2;
  iterator __begin2;
  MultipleOutputPairsType *__range2;
  string local_60;
  string local_30 [8];
  string dir;
  cmMakefileTargetGenerator *this_local;
  
  dir.field_2._8_8_ = this;
  (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
    _vptr_cmLocalGenerator[0xc])
            (local_30,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  std::__cxx11::string::operator=((string *)&this->InfoFileNameFull,local_30);
  std::__cxx11::string::operator+=((string *)&this->InfoFileNameFull,"/DependInfo.cmake");
  cmLocalUnixMakefileGenerator3::ConvertToFullPath
            (&local_60,this->LocalGenerator,&this->InfoFileNameFull);
  std::__cxx11::string::operator=((string *)&this->InfoFileNameFull,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  this_00 = (cmGeneratedFileStream *)operator_new(0x248);
  cmGeneratedFileStream::cmGeneratedFileStream(this_00,&this->InfoFileNameFull,false,None);
  this->InfoFileStream = this_00;
  cmGeneratedFileStream::SetCopyIfDifferent(this->InfoFileStream,true);
  bVar2 = std::ios::operator!((ios *)((long)&(this->InfoFileStream->super_ofstream).
                                             super_basic_ostream<char,_std::char_traits<char>_>.
                                             _vptr_basic_ostream +
                                     (long)(this->InfoFileStream->super_ofstream).
                                           super_basic_ostream<char,_std::char_traits<char>_>.
                                           _vptr_basic_ostream[-3]));
  if ((bVar2 & 1) == 0) {
    cmLocalUnixMakefileGenerator3::WriteDependLanguageInfo
              (this->LocalGenerator,(ostream *)this->InfoFileStream,
               (this->super_cmCommonTargetGenerator).GeneratorTarget);
    bVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::empty(&this->MultipleOutputPairs);
    if (!bVar3) {
      poVar4 = std::operator<<((ostream *)this->InfoFileStream,"\n");
      poVar4 = std::operator<<(poVar4,"# Pairs of files generated by the same build rule.\n");
      std::operator<<(poVar4,"set(CMAKE_MULTIPLE_OUTPUT_PAIRS\n");
      __end2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin(&this->MultipleOutputPairs);
      pi = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::end(&this->MultipleOutputPairs);
      while (bVar3 = std::operator!=(&__end2,(_Self *)&pi), bVar3) {
        local_88 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator*(&__end2);
        poVar4 = std::operator<<((ostream *)this->InfoFileStream,"  ");
        cmOutputConverter::EscapeForCMake(&local_a8,&local_88->first);
        poVar4 = std::operator<<(poVar4,(string *)&local_a8);
        poVar4 = std::operator<<(poVar4," ");
        cmOutputConverter::EscapeForCMake
                  ((string *)
                   &dirs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_88->second);
        poVar4 = std::operator<<(poVar4,(string *)
                                        &dirs.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::operator<<(poVar4,"\n");
        std::__cxx11::string::~string
                  ((string *)
                   &dirs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string((string *)&local_a8);
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator++(&__end2);
      }
      std::operator<<((ostream *)this->InfoFileStream,"  )\n\n");
    }
    poVar4 = std::operator<<((ostream *)this->InfoFileStream,"\n");
    poVar4 = std::operator<<(poVar4,"# Targets to which this target links.\n");
    std::operator<<(poVar4,"set(CMAKE_TARGET_LINKED_INFO_FILES\n");
    cmCommonTargetGenerator::GetLinkedTargetDirectories_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range1,&this->super_cmCommonTargetGenerator);
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range1);
    d = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range1);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&d), bVar3) {
      pbVar5 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
      poVar4 = std::operator<<((ostream *)this->InfoFileStream,"  \"");
      poVar4 = std::operator<<(poVar4,(string *)pbVar5);
      std::operator<<(poVar4,"/DependInfo.cmake\"\n");
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    std::operator<<((ostream *)this->InfoFileStream,"  )\n");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range1);
    psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                       ((cmLocalGenerator *)this->LocalGenerator);
    poVar4 = std::operator<<((ostream *)this->InfoFileStream,"\n");
    poVar4 = std::operator<<(poVar4,"# Fortran module output directory.\n");
    poVar4 = std::operator<<(poVar4,"set(CMAKE_Fortran_TARGET_MODULE_DIR \"");
    cmGeneratorTarget::GetFortranModuleDirectory
              ((string *)
               &depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (this->super_cmCommonTargetGenerator).GeneratorTarget,psVar6);
    poVar4 = std::operator<<(poVar4,(string *)
                                    &depends.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::operator<<(poVar4,"\")\n");
    std::__cxx11::string::~string
              ((string *)
               &depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&commands.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&depTarget.field_2 + 8));
    cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
              ((string *)local_178,this->LocalGenerator,
               (this->super_cmCommonTargetGenerator).GeneratorTarget);
    std::__cxx11::string::operator+=((string *)local_178,"/depend");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f0);
    poVar4 = std::operator<<((ostream *)local_2f0,"cd ");
    pcVar1 = this->LocalGenerator;
    psVar6 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar1);
    cmsys::SystemTools::CollapseFullPath(&local_330,psVar6);
    cmOutputConverter::ConvertToOutputFormat
              (&local_310,
               &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_330,SHELL);
    poVar4 = std::operator<<(poVar4,(string *)&local_310);
    std::operator<<(poVar4," && ");
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_330);
    poVar4 = std::operator<<((ostream *)local_2f0,"$(CMAKE_COMMAND) -E cmake_depends \"");
    (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
      _vptr_cmGlobalGenerator[3])(local_350);
    poVar4 = std::operator<<(poVar4,local_350);
    poVar4 = std::operator<<(poVar4,"\" ");
    pcVar1 = this->LocalGenerator;
    psVar6 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_((cmLocalGenerator *)pcVar1);
    cmsys::SystemTools::CollapseFullPath(&local_390,psVar6);
    cmOutputConverter::ConvertToOutputFormat
              (&local_370,
               &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_390,SHELL);
    poVar4 = std::operator<<(poVar4,(string *)&local_370);
    poVar4 = std::operator<<(poVar4," ");
    pcVar1 = this->LocalGenerator;
    psVar6 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_((cmLocalGenerator *)pcVar1);
    cmsys::SystemTools::CollapseFullPath(&local_3d0,psVar6);
    cmOutputConverter::ConvertToOutputFormat
              (&local_3b0,
               &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_3d0,SHELL);
    poVar4 = std::operator<<(poVar4,(string *)&local_3b0);
    poVar4 = std::operator<<(poVar4," ");
    pcVar1 = this->LocalGenerator;
    psVar6 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar1);
    cmsys::SystemTools::CollapseFullPath(&local_410,psVar6);
    cmOutputConverter::ConvertToOutputFormat
              (&local_3f0,
               &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_410,SHELL);
    poVar4 = std::operator<<(poVar4,(string *)&local_3f0);
    poVar4 = std::operator<<(poVar4," ");
    pcVar1 = this->LocalGenerator;
    psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar1);
    cmsys::SystemTools::CollapseFullPath(&local_450,psVar6);
    cmOutputConverter::ConvertToOutputFormat
              (&local_430,
               &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_450,SHELL);
    poVar4 = std::operator<<(poVar4,(string *)&local_430);
    poVar4 = std::operator<<(poVar4," ");
    pcVar1 = this->LocalGenerator;
    cmsys::SystemTools::CollapseFullPath(&local_490,&this->InfoFileNameFull);
    cmOutputConverter::ConvertToOutputFormat
              (&local_470,
               &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_490,SHELL);
    std::operator<<(poVar4,(string *)&local_470);
    std::__cxx11::string::~string((string *)&local_470);
    std::__cxx11::string::~string((string *)&local_490);
    std::__cxx11::string::~string((string *)&local_430);
    std::__cxx11::string::~string((string *)&local_450);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string(local_350);
    bVar3 = cmLocalUnixMakefileGenerator3::GetColorMakefile(this->LocalGenerator);
    if (bVar3) {
      std::operator<<((ostream *)local_2f0," --color=$(COLOR)");
    }
    std::__cxx11::ostringstream::str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&depTarget.field_2 + 8),&local_4b0);
    std::__cxx11::string::~string((string *)&local_4b0);
    if (this->CustomCommandDriver == OnDepends) {
      DriveCustomCommands(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&commands.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              (this->LocalGenerator,(ostream *)this->BuildFileStream,(char *)0x0,(string *)local_178
               ,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&commands.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&depTarget.field_2 + 8),true,false);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f0);
    std::__cxx11::string::~string((string *)local_178);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&depTarget.field_2 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&commands.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteTargetDependRules()
{
  // must write the targets depend info file
  std::string dir =
    this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget);
  this->InfoFileNameFull = dir;
  this->InfoFileNameFull += "/DependInfo.cmake";
  this->InfoFileNameFull =
    this->LocalGenerator->ConvertToFullPath(this->InfoFileNameFull);
  this->InfoFileStream = new cmGeneratedFileStream(this->InfoFileNameFull);
  this->InfoFileStream->SetCopyIfDifferent(true);
  if (!*this->InfoFileStream) {
    return;
  }
  this->LocalGenerator->WriteDependLanguageInfo(*this->InfoFileStream,
                                                this->GeneratorTarget);

  // Store multiple output pairs in the depend info file.
  if (!this->MultipleOutputPairs.empty()) {
    /* clang-format off */
    *this->InfoFileStream
      << "\n"
      << "# Pairs of files generated by the same build rule.\n"
      << "set(CMAKE_MULTIPLE_OUTPUT_PAIRS\n";
    /* clang-format on */
    for (auto const& pi : this->MultipleOutputPairs) {
      *this->InfoFileStream
        << "  " << cmOutputConverter::EscapeForCMake(pi.first) << " "
        << cmOutputConverter::EscapeForCMake(pi.second) << "\n";
    }
    *this->InfoFileStream << "  )\n\n";
  }

  // Store list of targets linked directly or transitively.
  {
    /* clang-format off */
  *this->InfoFileStream
    << "\n"
    << "# Targets to which this target links.\n"
    << "set(CMAKE_TARGET_LINKED_INFO_FILES\n";
    /* clang-format on */
    std::vector<std::string> dirs = this->GetLinkedTargetDirectories();
    for (std::string const& d : dirs) {
      *this->InfoFileStream << "  \"" << d << "/DependInfo.cmake\"\n";
    }
    *this->InfoFileStream << "  )\n";
  }

  std::string const& working_dir =
    this->LocalGenerator->GetCurrentBinaryDirectory();

  /* clang-format off */
  *this->InfoFileStream
    << "\n"
    << "# Fortran module output directory.\n"
    << "set(CMAKE_Fortran_TARGET_MODULE_DIR \""
    << this->GeneratorTarget->GetFortranModuleDirectory(working_dir)
    << "\")\n";
  /* clang-format on */

  // and now write the rule to use it
  std::vector<std::string> depends;
  std::vector<std::string> commands;

  // Construct the name of the dependency generation target.
  std::string depTarget =
    this->LocalGenerator->GetRelativeTargetDirectory(this->GeneratorTarget);
  depTarget += "/depend";

  // Add a command to call CMake to scan dependencies.  CMake will
  // touch the corresponding depends file after scanning dependencies.
  std::ostringstream depCmd;
// TODO: Account for source file properties and directory-level
// definitions when scanning for dependencies.
#if !defined(_WIN32) || defined(__CYGWIN__)
  // This platform supports symlinks, so cmSystemTools will translate
  // paths.  Make sure PWD is set to the original name of the home
  // output directory to help cmSystemTools to create the same
  // translation table for the dependency scanning process.
  depCmd << "cd "
         << (this->LocalGenerator->ConvertToOutputFormat(
              cmSystemTools::CollapseFullPath(
                this->LocalGenerator->GetBinaryDirectory()),
              cmOutputConverter::SHELL))
         << " && ";
#endif
  // Generate a call this signature:
  //
  //   cmake -E cmake_depends <generator>
  //                          <home-src-dir> <start-src-dir>
  //                          <home-out-dir> <start-out-dir>
  //                          <dep-info> --color=$(COLOR)
  //
  // This gives the dependency scanner enough information to recreate
  // the state of our local generator sufficiently for its needs.
  depCmd << "$(CMAKE_COMMAND) -E cmake_depends \""
         << this->GlobalGenerator->GetName() << "\" "
         << this->LocalGenerator->ConvertToOutputFormat(
              cmSystemTools::CollapseFullPath(
                this->LocalGenerator->GetSourceDirectory()),
              cmOutputConverter::SHELL)
         << " "
         << this->LocalGenerator->ConvertToOutputFormat(
              cmSystemTools::CollapseFullPath(
                this->LocalGenerator->GetCurrentSourceDirectory()),
              cmOutputConverter::SHELL)
         << " "
         << this->LocalGenerator->ConvertToOutputFormat(
              cmSystemTools::CollapseFullPath(
                this->LocalGenerator->GetBinaryDirectory()),
              cmOutputConverter::SHELL)
         << " "
         << this->LocalGenerator->ConvertToOutputFormat(
              cmSystemTools::CollapseFullPath(
                this->LocalGenerator->GetCurrentBinaryDirectory()),
              cmOutputConverter::SHELL)
         << " "
         << this->LocalGenerator->ConvertToOutputFormat(
              cmSystemTools::CollapseFullPath(this->InfoFileNameFull),
              cmOutputConverter::SHELL);
  if (this->LocalGenerator->GetColorMakefile()) {
    depCmd << " --color=$(COLOR)";
  }
  commands.push_back(depCmd.str());

  // Make sure all custom command outputs in this target are built.
  if (this->CustomCommandDriver == OnDepends) {
    this->DriveCustomCommands(depends);
  }

  // Write the rule.
  this->LocalGenerator->WriteMakeRule(*this->BuildFileStream, nullptr,
                                      depTarget, depends, commands, true);
}